

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetectorList::clearAllAccounting(MemoryLeakDetectorList *this,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorNode *pMVar2;
  
  pMVar1 = this->head_;
  if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
    pMVar2 = (MemoryLeakDetectorNode *)0x0;
    do {
      if (period == mem_leak_period_all) {
LAB_002bba42:
        pMVar1 = pMVar1->next_;
        if (pMVar2 == (MemoryLeakDetectorNode *)0x0) {
          this->head_ = pMVar1;
          pMVar2 = (MemoryLeakDetectorNode *)0x0;
        }
        else {
          pMVar2->next_ = pMVar1;
        }
      }
      else {
        if ((pMVar1->period_ == period) ||
           (period == mem_leak_period_enabled && pMVar1->period_ != mem_leak_period_disabled))
        goto LAB_002bba42;
        pMVar2 = pMVar1;
        pMVar1 = pMVar1->next_;
      }
    } while (pMVar1 != (MemoryLeakDetectorNode *)0x0);
  }
  return;
}

Assistant:

void MemoryLeakDetectorList::clearAllAccounting(MemLeakPeriod period)
{
    MemoryLeakDetectorNode* cur = head_;
    MemoryLeakDetectorNode* prev = NULLPTR;

    while (cur) {
        if (isInPeriod(cur, period)) {
            if (prev) {
                prev->next_ = cur->next_;
                cur = prev;
            }
            else {
                head_ = cur->next_;
                cur = head_;
                continue;
            }
        }
        prev = cur;
        cur = cur->next_;
    }
}